

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O1

realtype SUNRpowerR(realtype base,realtype exponent)

{
  double dVar1;
  
  if (base <= 0.0) {
    return 0.0;
  }
  dVar1 = pow(base,exponent);
  return dVar1;
}

Assistant:

realtype SUNRpowerR(realtype base, realtype exponent)
{
  if (base <= RCONST(0.0)) return(RCONST(0.0));

#if defined(SUNDIALS_USE_GENERIC_MATH)
  return((realtype) pow((double) base, (double) exponent));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  return(pow(base, exponent));
#elif defined(SUNDIALS_SINGLE_PRECISION)
  return(powf(base, exponent));
#elif defined(SUNDIALS_EXTENDED_PRECISION)
  return(powl(base, exponent));
#endif
}